

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

int dlep_writer_add_ip_tlv(dlep_writer *writer,netaddr *ip,_Bool add)

{
  undefined1 local_58;
  undefined1 local_57 [4];
  uint8_t local_53;
  uint8_t value [18];
  _Bool add_local;
  netaddr *ip_local;
  dlep_writer *writer_local;
  
  local_58 = add;
  netaddr_to_binary(local_57,ip,0x10);
  if (ip->_type == '\x02') {
    local_53 = ip->_prefix_len;
    if (local_53 == ' ') {
      dlep_writer_add_tlv(writer,8,&local_58,5);
    }
    else {
      dlep_writer_add_tlv(writer,10,&local_58,6);
    }
  }
  else {
    if (ip->_type != '\n') {
      return -1;
    }
    value[9] = ip->_prefix_len;
    if (value[9] == 0x80) {
      dlep_writer_add_tlv(writer,9,&local_58,0x11);
    }
    else {
      dlep_writer_add_tlv(writer,0xb,&local_58,0x12);
    }
  }
  return 0;
}

Assistant:

int
dlep_writer_add_ip_tlv(struct dlep_writer *writer, const struct netaddr *ip, bool add) {
  uint8_t value[18];

  value[0] = add ? DLEP_IP_ADD : DLEP_IP_REMOVE;
  netaddr_to_binary(&value[1], ip, 16);

  switch (netaddr_get_address_family(ip)) {
    case AF_INET:
      value[5] = netaddr_get_prefix_length(ip);
      if (value[5] != 32) {
        dlep_writer_add_tlv(writer, DLEP_IPV4_SUBNET_TLV, value, 6);
      }
      else {
        dlep_writer_add_tlv(writer, DLEP_IPV4_ADDRESS_TLV, value, 5);
      }
      break;
    case AF_INET6:
      value[17] = netaddr_get_prefix_length(ip);
      if (value[17] != 128) {
        dlep_writer_add_tlv(writer, DLEP_IPV6_SUBNET_TLV, value, 18);
      }
      else {
        dlep_writer_add_tlv(writer, DLEP_IPV6_ADDRESS_TLV, value, 17);
      }
      break;
    default:
      return -1;
  }
  return 0;
}